

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

int isscalar(Context *ctx,MOJOSHADER_shaderType shader_type,RegisterType rtype,int rnum)

{
  int iVar1;
  int iVar2;
  RegisterList *pRVar3;
  bool local_3e;
  bool local_3d;
  MOJOSHADER_usage usage;
  RegisterList *reg;
  int uses_fog;
  int uses_psize;
  int rnum_local;
  RegisterType rtype_local;
  MOJOSHADER_shaderType shader_type_local;
  Context *ctx_local;
  
  iVar1 = ctx->uses_pointsize;
  iVar2 = ctx->uses_fog;
  if ((rtype == REG_TYPE_OUTPUT) &&
     (((iVar1 != 0 || (iVar2 != 0)) &&
      (pRVar3 = reglist_find(&ctx->attributes,REG_TYPE_OUTPUT,rnum), pRVar3 != (RegisterList *)0x0))
     )) {
    if ((iVar1 == 0) || (local_3d = true, pRVar3->usage != MOJOSHADER_USAGE_POINTSIZE)) {
      local_3e = iVar2 != 0 && pRVar3->usage == MOJOSHADER_USAGE_FOG;
      local_3d = local_3e;
    }
    ctx_local._4_4_ = (uint)local_3d;
  }
  else {
    ctx_local._4_4_ = scalar_register(shader_type,rtype,rnum);
  }
  return ctx_local._4_4_;
}

Assistant:

static int isscalar(Context *ctx, const MOJOSHADER_shaderType shader_type,
                    const RegisterType rtype, const int rnum)
{
    const int uses_psize = ctx->uses_pointsize;
    const int uses_fog = ctx->uses_fog;
    if ( (rtype == REG_TYPE_OUTPUT) && ((uses_psize) || (uses_fog)) )
    {
        const RegisterList *reg = reglist_find(&ctx->attributes, rtype, rnum);
        if (reg != NULL)
        {
            const MOJOSHADER_usage usage = reg->usage;
            return ( (uses_psize && (usage == MOJOSHADER_USAGE_POINTSIZE)) ||
                     (uses_fog && (usage == MOJOSHADER_USAGE_FOG)) );
        } // if
    } // if

    return scalar_register(shader_type, rtype, rnum);
}